

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module_exposed_annotated_type.cpp
# Opt level: O1

int main(void)

{
  injector__<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>
  iVar1;
  injector *piVar2;
  long lVar3;
  i injector;
  injector__<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>
  local_a8 [2];
  scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
  local_98 [2];
  scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
  local_88 [2];
  scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
  local_78 [2];
  scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
  local_68 [2];
  scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
  local_58;
  scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
  local_50 [2];
  scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
  local_40 [2];
  
  piVar2 = (injector *)operator_new(0x18);
  (piVar2->
  super_injector__<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>
  ).f = boost::ext::di::v1_3_0::scopes::instance::
        scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
        ::
        injector_impl<boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_impl1,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_void,_boost::ext::di::v1_3_0::core::none>_>_>
        ::
        create<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>,_boost::ext::di::v1_3_0::aux::integral_constant<bool,_true>_>
        ::impl;
  piVar2->dtor = boost::ext::di::v1_3_0::scopes::instance::
                 scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
                 ::
                 injector_impl<boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_impl1,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_void,_boost::ext::di::v1_3_0::core::none>_>_>
                 ::dtor_impl;
  local_78[0].injector_ = (injector *)0x0;
  local_68[0].injector_ = (injector *)0x0;
  local_a8[0].f =
       (_func_unique_ptr<i1,_std::default_delete<i1>_>_injector__<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>_ptr
        *)0x0;
  local_88[0].injector_ = piVar2;
  boost::ext::di::v1_3_0::scopes::instance::
  scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
  ::~scope((scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
            *)local_a8);
  boost::ext::di::v1_3_0::scopes::instance::
  scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
  ::~scope(local_68);
  boost::ext::di::v1_3_0::scopes::instance::
  scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
  ::~scope(local_78);
  local_88[0].injector_ = (injector *)0x0;
  local_50[0].injector_ = (injector *)0x0;
  local_78[0].injector_ = (injector *)0x0;
  local_68[0].injector_ = (injector *)0x0;
  local_a8[0].f =
       (_func_unique_ptr<i1,_std::default_delete<i1>_>_injector__<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>_ptr
        *)0x0;
  local_58.injector_ = (injector *)0x0;
  local_40[0].injector_ = piVar2;
  boost::ext::di::v1_3_0::scopes::instance::
  scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
  ::~scope(&local_58);
  boost::ext::di::v1_3_0::scopes::instance::
  scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
  ::~scope((scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
            *)local_a8);
  boost::ext::di::v1_3_0::scopes::instance::
  scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
  ::~scope(local_68);
  boost::ext::di::v1_3_0::scopes::instance::
  scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
  ::~scope(local_78);
  local_40[0].injector_ = (injector *)0x0;
  local_98[0].injector_ = piVar2;
  boost::ext::di::v1_3_0::scopes::instance::
  scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
  ::~scope(local_40);
  boost::ext::di::v1_3_0::scopes::instance::
  scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
  ::~scope(local_50);
  boost::ext::di::v1_3_0::scopes::instance::
  scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
  ::~scope(local_88);
  (*(piVar2->
    super_injector__<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>
    ).f)(local_a8);
  iVar1.f = local_a8[0].f;
  if (local_a8[0].f !=
      (_func_unique_ptr<i1,_std::default_delete<i1>_>_injector__<boost::ext::di::v1_3_0::named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_module_exposed_annotated_type_cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>_ptr
       *)0x0) {
    lVar3 = __dynamic_cast(local_a8[0].f,&i1::typeinfo,&impl1::typeinfo,0);
    if (lVar3 != 0) {
      (**(code **)(*(long *)iVar1.f + 8))(iVar1.f);
      boost::ext::di::v1_3_0::scopes::instance::
      scope<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_i1>_>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp:23:16),_std::unique_ptr<i1,_std::default_delete<i1>_>_>_>,_int>
      ::~scope(local_98);
      return 0;
    }
  }
  __assert_fail("dynamic_cast<impl1*>(object->up.get())",
                "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module_exposed_annotated_type.cpp"
                ,0x29,"int main()");
}

Assistant:

int main() {
  auto injector = di::make_injector(module());
  auto object = injector.create<std::unique_ptr<T>>();
  assert(dynamic_cast<impl1*>(object->up.get()));
}